

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_close(uv_signal_t *handle)

{
  long in_RDI;
  uv_signal_t *in_stack_00000080;
  
  uv__signal_stop(in_stack_00000080);
  if (*(int *)(in_RDI + 0x70) == *(int *)(in_RDI + 0x74)) {
    uv__make_close_pending((uv_handle_t *)0x114107);
  }
  return;
}

Assistant:

void uv__signal_close(uv_signal_t* handle) {

  uv__signal_stop(handle);

  /* If there are any caught signals "trapped" in the signal pipe, we can't
   * call the close callback yet. Otherwise, add the handle to the finish_close
   * queue.
   */
  if (handle->caught_signals == handle->dispatched_signals) {
    uv__make_close_pending((uv_handle_t*) handle);
  }
}